

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz.cpp
# Opt level: O1

void (anonymous_namespace)::Scaler5x<(anonymous_namespace)::ColorGradientRGB>::alphaGrad<86u,100u>
               (uint32_t *pixBack,uint32_t pixFront)

{
  uint uVar1;
  
  uVar1 = *pixBack;
  *pixBack = ((uVar1 & 0xff) * 0xe + (pixFront & 0xff) * 0x56) * 0x147b >> 0x13 & 0xff |
             ((uVar1 >> 8 & 0xff) * 0xe + (pixFront >> 8 & 0xff) * 0x56) * 0x147b >> 0xb & 0xff00 |
             ((uVar1 >> 0x10 & 0xff) * 0xe + (pixFront >> 0x10 & 0xff) * 0x56) * 0x147b >> 3 &
             0xff0000;
  return;
}

Assistant:

static void alphaGrad(uint32_t& pixBack, uint32_t pixFront) { ColorGradient::template alphaGrad<M, N>(pixBack, pixFront); }